

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.c
# Opt level: O2

size_t x86_code(void *simple_ptr,uint32_t now_pos,_Bool is_encoder,uint8_t *buffer,size_t size)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (size < 5) {
    return 0;
  }
  uVar1 = *simple_ptr;
  iVar5 = now_pos - 5;
  if (now_pos - *(int *)((long)simple_ptr + 4) < 6) {
    iVar5 = *(int *)((long)simple_ptr + 4);
  }
  uVar6 = 0;
  do {
    iVar2 = (now_pos + (int)uVar6) - iVar5;
    while( true ) {
      if (size - 5 < uVar6) {
        *(uint *)simple_ptr = uVar1;
        *(int *)((long)simple_ptr + 4) = iVar5;
        return uVar6;
      }
      if (0xfd < (byte)(buffer[uVar6] + 0x16)) break;
      uVar6 = uVar6 + 1;
      iVar2 = iVar2 + 1;
    }
    iVar4 = (int)uVar6;
    uVar9 = 0;
    if ((now_pos - iVar5) + iVar4 < 6) {
      while (bVar10 = iVar2 != 0, iVar2 = iVar2 + -1, bVar10) {
        uVar1 = (uVar1 & 0x77) * 2;
      }
      uVar9 = (ulong)uVar1;
    }
    uVar1 = 1;
    uVar8 = (uint)uVar9;
    if ((byte)(buffer[uVar6 + 4] + 1) < 2) {
      uVar1 = 0x11;
      if ((x86_code::MASK_TO_ALLOWED_STATUS[(uint)(uVar9 >> 1) & 7] != true) || (0x1f < uVar8))
      goto LAB_0036ddcd;
      uVar1 = (uint)buffer[uVar6 + 1] |
              (uint)buffer[uVar6 + 2] << 8 |
              (uint)buffer[uVar6 + 3] << 0x10 | (uint)buffer[uVar6 + 4] << 0x18;
      iVar5 = (-5 - now_pos) - iVar4;
      if (is_encoder) {
        iVar5 = now_pos + iVar4 + 5;
      }
      while (uVar1 = uVar1 + iVar5, uVar8 != 0) {
        cVar7 = (char)(x86_code::MASK_TO_BIT_NUMBER[uVar9 >> 1] << 3);
        uVar3 = uVar1 >> (0x18U - cVar7 & 0x1f);
        if (((char)uVar3 != -1) && ((uVar3 & 0xff) != 0)) break;
        uVar1 = ~(uVar1 ^ (uint)(-1L << (-(cVar7 + ' ') & 0x3fU)));
      }
      buffer[uVar6 + 4] = (uint8_t)((int)(uVar1 * 0x80) >> 0x1f);
      buffer[uVar6 + 3] = (uint8_t)(uVar1 >> 0x10);
      buffer[uVar6 + 2] = (uint8_t)(uVar1 >> 8);
      buffer[uVar6 + 1] = (uint8_t)uVar1;
      uVar6 = uVar6 + 5;
      uVar1 = 0;
    }
    else {
LAB_0036ddcd:
      uVar6 = uVar6 + 1;
      uVar1 = uVar1 | uVar8;
    }
    iVar5 = iVar4 + now_pos;
  } while( true );
}

Assistant:

static size_t
x86_code(void *simple_ptr, uint32_t now_pos, bool is_encoder,
		uint8_t *buffer, size_t size)
{
	static const bool MASK_TO_ALLOWED_STATUS[8]
		= { true, true, true, false, true, false, false, false };

	static const uint32_t MASK_TO_BIT_NUMBER[8]
			= { 0, 1, 2, 2, 3, 3, 3, 3 };

	lzma_simple_x86 *simple = simple_ptr;
	uint32_t prev_mask = simple->prev_mask;
	uint32_t prev_pos = simple->prev_pos;

	if (size < 5)
		return 0;

	if (now_pos - prev_pos > 5)
		prev_pos = now_pos - 5;

	const size_t limit = size - 5;
	size_t buffer_pos = 0;

	while (buffer_pos <= limit) {
		uint8_t b = buffer[buffer_pos];
		if (b != 0xE8 && b != 0xE9) {
			++buffer_pos;
			continue;
		}

		const uint32_t offset = now_pos + (uint32_t)(buffer_pos)
				- prev_pos;
		prev_pos = now_pos + (uint32_t)(buffer_pos);

		if (offset > 5) {
			prev_mask = 0;
		} else {
			for (uint32_t i = 0; i < offset; ++i) {
				prev_mask &= 0x77;
				prev_mask <<= 1;
			}
		}

		b = buffer[buffer_pos + 4];

		if (Test86MSByte(b)
			&& MASK_TO_ALLOWED_STATUS[(prev_mask >> 1) & 0x7]
				&& (prev_mask >> 1) < 0x10) {

			uint32_t src = ((uint32_t)(b) << 24)
				| ((uint32_t)(buffer[buffer_pos + 3]) << 16)
				| ((uint32_t)(buffer[buffer_pos + 2]) << 8)
				| (buffer[buffer_pos + 1]);

			uint32_t dest;
			while (true) {
				if (is_encoder)
					dest = src + (now_pos + (uint32_t)(
							buffer_pos) + 5);
				else
					dest = src - (now_pos + (uint32_t)(
							buffer_pos) + 5);

				if (prev_mask == 0)
					break;

				const uint32_t i = MASK_TO_BIT_NUMBER[
						prev_mask >> 1];

				b = (uint8_t)(dest >> (24 - i * 8));

				if (!Test86MSByte(b))
					break;

				src = dest ^ ((1ull << (32 - i * 8)) - 1);
			}

			buffer[buffer_pos + 4]
					= (uint8_t)(~(((dest >> 24) & 1) - 1));
			buffer[buffer_pos + 3] = (uint8_t)(dest >> 16);
			buffer[buffer_pos + 2] = (uint8_t)(dest >> 8);
			buffer[buffer_pos + 1] = (uint8_t)(dest);
			buffer_pos += 5;
			prev_mask = 0;

		} else {
			++buffer_pos;
			prev_mask |= 1;
			if (Test86MSByte(b))
				prev_mask |= 0x10;
		}
	}

	simple->prev_mask = prev_mask;
	simple->prev_pos = prev_pos;

	return buffer_pos;
}